

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall VertexAttrib64Bit::VAOTest::initBuffers(VAOTest *this)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  unsigned_short *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar1 = this->m_bo_1_batch_size;
  uVar6 = this->m_n_batches;
  uVar11 = (ulong)uVar6;
  uVar9 = uVar6 * uVar1;
  this->m_bo_1_data_size = uVar9;
  uVar12 = this->m_bo_2_batch_size * uVar6;
  this->m_bo_2_data_size = uVar12;
  this->m_bo_index_data_size = uVar6 * 2;
  puVar3 = (uchar *)operator_new__((ulong)uVar9);
  this->m_bo_1_data = puVar3;
  puVar4 = (uchar *)operator_new__((ulong)uVar12);
  this->m_bo_2_data = puVar4;
  puVar5 = (unsigned_short *)operator_new__((ulong)(uVar6 * 2));
  this->m_bo_index_data = puVar5;
  if ((uVar6 & 0xffff) != 0) {
    uVar8 = 0;
    do {
      uVar6 = uVar6 - 1;
      puVar5[uVar8] = (unsigned_short)uVar6;
      uVar8 = uVar8 + 1;
    } while ((uVar11 & 0xffff) != uVar8);
  }
  if (uVar11 != 0) {
    uVar6 = this->m_bo_1_offset_matrix;
    uVar8 = 0;
    iVar2 = 1;
    uVar7 = 0;
    do {
      lVar10 = 0;
      do {
        *(double *)(puVar3 + lVar10 * 8 + uVar8 + uVar6) = (double)(uint)(iVar2 + (int)lVar10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 9);
      uVar7 = uVar7 + 1;
      uVar8 = (ulong)((int)uVar8 + uVar1);
      iVar2 = iVar2 + 9;
    } while (uVar7 != uVar11);
  }
  uVar1 = this->m_n_batches;
  if (uVar1 != 0) {
    uVar6 = 0;
    do {
      this->m_bo_1_data[(ulong)this->m_bo_1_offset_ubyte + (ulong)(this->m_bo_1_batch_size * uVar6)]
           = (uchar)uVar6;
      uVar6 = uVar6 + 1;
      uVar1 = this->m_n_batches;
    } while (uVar6 < uVar1);
  }
  if (uVar1 != 0) {
    uVar6 = this->m_bo_1_offset_short;
    puVar3 = this->m_bo_1_data;
    uVar9 = this->m_bo_1_batch_size;
    uVar12 = 0;
    uVar11 = 0;
    do {
      *(short *)(puVar3 + (ulong)uVar12 + (ulong)uVar6) = (short)uVar11;
      uVar11 = uVar11 + 1;
      uVar12 = uVar12 + uVar9;
    } while (uVar1 != uVar11);
  }
  if (this->m_n_batches != 0) {
    uVar1 = 0;
    uVar6 = 1;
    do {
      uVar12 = this->m_bo_1_batch_size * uVar1;
      puVar3 = this->m_bo_1_data;
      uVar9 = this->m_bo_1_offset_double;
      *(double *)(puVar3 + (ulong)uVar9 + (ulong)uVar12) = (double)(uVar6 - 1);
      *(double *)(puVar3 + (ulong)uVar9 + 8 + (ulong)uVar12) = (double)uVar6;
      uVar1 = uVar1 + 1;
      uVar6 = uVar6 + 2;
    } while (uVar1 < this->m_n_batches);
  }
  if (this->m_n_batches != 0) {
    uVar1 = 0;
    do {
      this->m_bo_2_data[(ulong)this->m_bo_2_offset_sbyte + (ulong)(this->m_bo_2_batch_size * uVar1)]
           = (uchar)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_n_batches);
  }
  if (this->m_n_batches != 0) {
    iVar2 = 0;
    uVar11 = 0;
    do {
      uVar1 = this->m_bo_2_offset_matrix;
      uVar6 = this->m_bo_2_batch_size;
      puVar3 = this->m_bo_2_data;
      lVar10 = 0;
      do {
        *(double *)(puVar3 + lVar10 * 8 + (ulong)(uVar6 * (int)uVar11) + (ulong)uVar1) =
             (double)(uint)(iVar2 + (int)lVar10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      uVar11 = uVar11 + 1;
      iVar2 = iVar2 + 8;
    } while (uVar11 < this->m_n_batches);
  }
  return;
}

Assistant:

void VAOTest::initBuffers()
{
	DE_ASSERT(m_bo_1_data == DE_NULL);
	DE_ASSERT(m_bo_2_data == DE_NULL);
	DE_ASSERT(m_bo_index_data == DE_NULL);

	/* Prepare buffers storing underlying data. The buffers will be used for:
	 *
	 * - storage purposes;
	 * - verification of the data XFBed from the vertex shader.
	 */
	m_bo_1_data_size	 = m_bo_1_batch_size * m_n_batches;
	m_bo_2_data_size	 = m_bo_2_batch_size * m_n_batches;
	m_bo_index_data_size = static_cast<unsigned int>(sizeof(unsigned short) * m_n_batches);

	m_bo_1_data		= new unsigned char[m_bo_1_data_size];
	m_bo_2_data		= new unsigned char[m_bo_2_data_size];
	m_bo_index_data = new unsigned short[m_bo_index_data_size / sizeof(unsigned short)];

	/* Workaround for alignment issue that may result in bus error on some platforms */
	union {
		double		  d;
		unsigned char c[sizeof(double)];
	} u;

	/* Fill index data */
	for (unsigned short n_index = 0; n_index < (unsigned short)m_n_batches; ++n_index)
	{
		m_bo_index_data[n_index] = (unsigned short)((unsigned short)(m_n_batches - 1) - n_index);
	}

	/* Fill 3x3 matrix data in BO1 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		double* matrix_ptr = (double*)(m_bo_1_data + n_matrix * m_bo_1_batch_size + m_bo_1_offset_matrix);

		for (unsigned int n_element = 0; n_element < 9 /* 3x3 matrix */; ++n_element)
		{
			matrix_ptr[n_element] = (double)(n_matrix * 3 * 3 + n_element + 1);
		}
	} /* for (all matrices) */

	/* Fill unsigned byte data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned char* data_ptr = m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_ubyte;

		*data_ptr = (unsigned char)n_element;
	}

	/* Fill short data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned short* data_ptr = (unsigned short*)(m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_short);

		*data_ptr = (unsigned short)n_element;
	}

	/* Fill 2 doubles data in BO1 */
	for (unsigned int n_batch = 0; n_batch < m_n_batches; ++n_batch)
	{
		unsigned char* data1_ptr = m_bo_1_data + n_batch * m_bo_1_batch_size + m_bo_1_offset_double;
		unsigned char* data2_ptr = data1_ptr + sizeof(double);

		u.d = (double)(2 * n_batch);
		memcpy(data1_ptr, u.c, sizeof(double));
		u.d = (double)(2 * n_batch + 1);
		memcpy(data2_ptr, u.c, sizeof(double));
	}

	/* Fill signed byte data in BO2 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		signed char* data_ptr = (signed char*)(m_bo_2_data + n_element * m_bo_2_batch_size + m_bo_2_offset_sbyte);

		*data_ptr = (signed char)n_element;
	}

	/* Fill 4x2 matrix data in BO2 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		unsigned char* matrix_ptr = m_bo_2_data + n_matrix * m_bo_2_batch_size + m_bo_2_offset_matrix;

		for (unsigned int n_element = 0; n_element < 8 /* 4x2 matrix */; ++n_element)
		{
			u.d = (double)(n_matrix * 4 * 2 + n_element);
			memcpy(matrix_ptr + (sizeof(double) * n_element), u.c, sizeof(double));
		}
	} /* for (all matrices) */
}